

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void __thiscall
JSON::JSON(JSON *this,unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> *value)

{
  _Head_base<0UL,_JSON::JSON_value_*,_false> _Var1;
  Members *__p;
  
  __p = (Members *)operator_new(0x18);
  _Var1._M_head_impl =
       (value->_M_t).super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>
       ._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
       super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl;
  (value->_M_t).super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t
  .super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
  super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl = (JSON_value *)0x0;
  (__p->value)._M_t.super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
  _M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
  super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl = _Var1._M_head_impl;
  __p->start = 0;
  __p->end = 0;
  std::__shared_ptr<JSON::Members,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<JSON::Members,void>
            ((__shared_ptr<JSON::Members,(__gnu_cxx::_Lock_policy)2> *)this,__p);
  return;
}

Assistant:

JSON::JSON(std::unique_ptr<JSON_value> value) :
    m(new Members(std::move(value)))
{
}